

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_db_config(sqlite3 *db,int op,...)

{
  ulong uVar1;
  int iVar2;
  Vdbe *pVVar3;
  long lVar4;
  u64 uVar5;
  va_list ap;
  char *local_a8;
  uint *local_a0;
  int local_98;
  
  if (op == 1000) {
    db->aDb->zDbSName = local_a8;
    iVar2 = 0;
  }
  else if (op == 0x3e9) {
    iVar2 = setupLookaside(db,local_a8,(int)local_a0,local_98);
  }
  else {
    lVar4 = 0;
    do {
      if (sqlite3_db_config::aFlagOp[lVar4].op == op) {
        uVar1 = db->flags;
        if ((int)local_a8 < 1) {
          if ((int)local_a8 != 0) goto LAB_00122356;
          uVar5 = ~(ulong)sqlite3_db_config::aFlagOp[lVar4].mask & uVar1;
        }
        else {
          uVar5 = sqlite3_db_config::aFlagOp[lVar4].mask | uVar1;
        }
        db->flags = uVar5;
LAB_00122356:
        if (uVar1 != db->flags) {
          for (pVVar3 = db->pVdbe; pVVar3 != (Vdbe *)0x0; pVVar3 = pVVar3->pNext) {
            pVVar3->field_0xc6 = (pVVar3->field_0xc6 & 0xfc) + 1;
          }
        }
        if (local_a0 == (uint *)0x0) {
          return 0;
        }
        *local_a0 = (uint)((sqlite3_db_config::aFlagOp[lVar4].mask & (uint)db->flags) != 0);
        return 0;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_db_config(sqlite3 *db, int op, ...){
  va_list ap;
  int rc;
  va_start(ap, op);
  switch( op ){
    case SQLITE_DBCONFIG_MAINDBNAME: {
      /* IMP: R-06824-28531 */
      /* IMP: R-36257-52125 */
      db->aDb[0].zDbSName = va_arg(ap,char*);
      rc = SQLITE_OK;
      break;
    }
    case SQLITE_DBCONFIG_LOOKASIDE: {
      void *pBuf = va_arg(ap, void*); /* IMP: R-26835-10964 */
      int sz = va_arg(ap, int);       /* IMP: R-47871-25994 */
      int cnt = va_arg(ap, int);      /* IMP: R-04460-53386 */
      rc = setupLookaside(db, pBuf, sz, cnt);
      break;
    }
    default: {
      static const struct {
        int op;      /* The opcode */
        u32 mask;    /* Mask of the bit in sqlite3.flags to set/clear */
      } aFlagOp[] = {
        { SQLITE_DBCONFIG_ENABLE_FKEY,           SQLITE_ForeignKeys    },
        { SQLITE_DBCONFIG_ENABLE_TRIGGER,        SQLITE_EnableTrigger  },
        { SQLITE_DBCONFIG_ENABLE_VIEW,           SQLITE_EnableView     },
        { SQLITE_DBCONFIG_ENABLE_FTS3_TOKENIZER, SQLITE_Fts3Tokenizer  },
        { SQLITE_DBCONFIG_ENABLE_LOAD_EXTENSION, SQLITE_LoadExtension  },
        { SQLITE_DBCONFIG_NO_CKPT_ON_CLOSE,      SQLITE_NoCkptOnClose  },
        { SQLITE_DBCONFIG_ENABLE_QPSG,           SQLITE_EnableQPSG     },
        { SQLITE_DBCONFIG_TRIGGER_EQP,           SQLITE_TriggerEQP     },
        { SQLITE_DBCONFIG_RESET_DATABASE,        SQLITE_ResetDatabase  },
        { SQLITE_DBCONFIG_DEFENSIVE,             SQLITE_Defensive      },
        { SQLITE_DBCONFIG_WRITABLE_SCHEMA,       SQLITE_WriteSchema|
                                                 SQLITE_NoSchemaError  },
        { SQLITE_DBCONFIG_LEGACY_ALTER_TABLE,    SQLITE_LegacyAlter    },
        { SQLITE_DBCONFIG_DQS_DDL,               SQLITE_DqsDDL         },
        { SQLITE_DBCONFIG_DQS_DML,               SQLITE_DqsDML         },
        { SQLITE_DBCONFIG_LEGACY_FILE_FORMAT,    SQLITE_LegacyFileFmt  },
        { SQLITE_DBCONFIG_TRUSTED_SCHEMA,        SQLITE_TrustedSchema  },
      };
      unsigned int i;
      rc = SQLITE_ERROR; /* IMP: R-42790-23372 */
      for(i=0; i<ArraySize(aFlagOp); i++){
        if( aFlagOp[i].op==op ){
          int onoff = va_arg(ap, int);
          int *pRes = va_arg(ap, int*);
          u64 oldFlags = db->flags;
          if( onoff>0 ){
            db->flags |= aFlagOp[i].mask;
          }else if( onoff==0 ){
            db->flags &= ~(u64)aFlagOp[i].mask;
          }
          if( oldFlags!=db->flags ){
            sqlite3ExpirePreparedStatements(db, 0);
          }
          if( pRes ){
            *pRes = (db->flags & aFlagOp[i].mask)!=0;
          }
          rc = SQLITE_OK;
          break;
        }
      }
      break;
    }
  }
  va_end(ap);
  return rc;
}